

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs-libc.c
# Opt level: O2

JSValue js_std_tmpfile(JSContext *ctx,JSValue this_val,int argc,JSValue *argv)

{
  FILE *f;
  int *piVar1;
  int err;
  JSValue JVar2;
  
  f = tmpfile();
  if (0 < argc) {
    err = 0;
    if (f == (FILE *)0x0) {
      piVar1 = __errno_location();
      err = *piVar1;
    }
    js_set_error_object(ctx,*argv,err);
  }
  if (f == (FILE *)0x0) {
    JVar2 = (JSValue)(ZEXT816(2) << 0x40);
  }
  else {
    JVar2 = js_new_std_file(ctx,(FILE *)f,1,0);
  }
  return JVar2;
}

Assistant:

static JSValue js_std_tmpfile(JSContext *ctx, JSValueConst this_val,
                              int argc, JSValueConst *argv)
{
    FILE *f;
    f = tmpfile();
    if (argc >= 1)
        js_set_error_object(ctx, argv[0], f ? 0 : errno);
    if (!f)
        return JS_NULL;
    return js_new_std_file(ctx, f, TRUE, FALSE);
}